

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeExV(char *str_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  ImGuiWindow *fmt_00;
  char **in_RCX;
  ImGuiWindow *in_RDX;
  char *label_end;
  char *label;
  ImGuiWindow *window;
  char *in_stack_00000108;
  char *in_stack_00000110;
  ImGuiTreeNodeFlags in_stack_0000011c;
  ImGuiID in_stack_00000120;
  __va_list_tag *in_stack_ffffffffffffffc8;
  bool local_1;
  
  fmt_00 = GetCurrentWindow();
  if ((fmt_00->SkipItems & 1U) == 0) {
    ImFormatStringToTempBufferV(&in_RDX->Name,in_RCX,(char *)fmt_00,in_stack_ffffffffffffffc8);
    ImGuiWindow::GetID(in_RDX,(char *)in_RCX,(char *)fmt_00);
    local_1 = TreeNodeBehavior(in_stack_00000120,in_stack_0000011c,in_stack_00000110,
                               in_stack_00000108);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeExV(const char* str_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const char* label, *label_end;
    ImFormatStringToTempBufferV(&label, &label_end, fmt, args);
    return TreeNodeBehavior(window->GetID(str_id), flags, label, label_end);
}